

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsViewPrivate::QGraphicsViewPrivate(QGraphicsViewPrivate *this)

{
  QAbstractScrollAreaPrivate *in_RDI;
  QList<QStyleOptionGraphicsItem> *in_stack_00000018;
  qsizetype in_stack_00000058;
  undefined4 in_stack_ffffffffffffffe8;
  RenderHint in_stack_ffffffffffffffec;
  
  QAbstractScrollAreaPrivate::QAbstractScrollAreaPrivate(in_RDI);
  *(undefined ***)&(in_RDI->super_QFramePrivate).super_QWidgetPrivate =
       &PTR__QGraphicsViewPrivate_00d355f0;
  QFlags<QPainter::RenderHint>::QFlags
            ((QFlags<QPainter::RenderHint> *)in_RDI,in_stack_ffffffffffffffec);
  *(undefined4 *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x4 = 0;
  *(uint *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 =
       *(uint *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 & 0xfffffffe | 1;
  *(uint *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 =
       *(uint *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 & 0xfffffffd;
  *(uint *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 =
       *(uint *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 & 0xfffffffb;
  *(uint *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 =
       *(uint *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 & 0xfffffff7;
  *(uint *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 =
       *(uint *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 & 0xffffffef | 0x10;
  *(uint *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 =
       *(uint *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 & 0xffffffdf | 0x20;
  *(uint *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 =
       *(uint *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 & 0xffffffbf | 0x40;
  *(uint *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 =
       *(uint *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 & 0xffffff7f | 0x80;
  *(uint *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 =
       *(uint *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 & 0xfffffeff;
  *(uint *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 =
       *(uint *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 & 0xfffffdff;
  *(uint *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 =
       *(uint *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 & 0xfffffbff;
  *(uint *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 =
       *(uint *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 & 0xfffff7ff | 0x800;
  *(uint *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 =
       *(uint *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 & 0xffffefff | 0x1000;
  *(uint *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 =
       *(uint *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 & 0xffffdfff;
  QRectF::QRectF((QRectF *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x10);
  QRect::QRect((QRect *)in_RDI);
  QPointF::QPointF((QPointF *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x40);
  QPointF::QPointF((QPointF *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x50);
  QPoint::QPoint((QPoint *)in_RDI);
  QPoint::QPoint((QPoint *)in_RDI);
  QPointF::QPointF((QPointF *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x70);
  QPointF::QPointF((QPointF *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.focus_next);
  QPoint::QPoint((QPoint *)in_RDI);
  QPoint::QPoint((QPoint *)in_RDI);
  *(undefined4 *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.needsFlush = 0;
  QTransform::QTransform((QTransform *)in_RDI);
  in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.statusTip.d.d = (Data *)0x0;
  in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.statusTip.d.ptr = (char16_t *)0x0;
  QEventStorage<QMouseEvent>::QEventStorage
            ((QEventStorage<QMouseEvent> *)
             &in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.statusTip.d.size);
  QPointF::QPointF((QPointF *)
                   &in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.accessibleIdentifier.d.ptr);
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)in_RDI,in_stack_ffffffffffffffec);
  in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.inheritedFontResolveMask = 1;
  *(undefined4 *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.directPaletteResolveMask = 0;
  *(undefined4 *)
   ((long)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.directPaletteResolveMask + 4) = 1;
  QFlags<QGraphicsView::OptimizationFlag>::QFlags
            ((QFlags<QGraphicsView::OptimizationFlag> *)0xa316ac);
  *(undefined1 *)
   ((long)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.inheritedPaletteResolveMask + 4) = 0;
  QPointer<QGraphicsScene>::QPointer
            ((QPointer<QGraphicsScene> *)in_RDI,
             (nullptr_t)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  QRect::QRect((QRect *)in_RDI);
  *(undefined1 *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.data.widget_attributes = 0;
  in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.data.window_flags.
  super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i = 1;
  *(undefined4 *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.data.field_0x10 = 0;
  in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.data.crect.x1.m_i = 0;
  QFlags<QGraphicsView::CacheModeFlag>::QFlags((QFlags<QGraphicsView::CacheModeFlag> *)0xa3170f);
  QList<QStyleOptionGraphicsItem>::QList((QList<QStyleOptionGraphicsItem> *)0xa31720);
  QBrush::QBrush((QBrush *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.data.fnt);
  QBrush::QBrush((QBrush *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.data.field_0x40);
  QPixmap::QPixmap((QPixmap *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.data.wrect);
  QRegion::QRegion((QRegion *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.locale);
  QCursor::QCursor((QCursor *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.redirectOffset);
  *(undefined1 *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.actions.d.d = 0;
  in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.actions.d.ptr = (QAction **)0x0;
  QRegion::QRegion((QRegion *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.actions.d.size);
  QRect::QRect((QRect *)in_RDI);
  *(undefined1 *)(in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.high_attributes + 2) = 0;
  QRegion::QRegion((QRegion *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x250);
  QList<QStyleOptionGraphicsItem>::reserve(in_stack_00000018,in_stack_00000058);
  return;
}

Assistant:

QGraphicsViewPrivate::QGraphicsViewPrivate()
    : renderHints(QPainter::TextAntialiasing),
      dragMode(QGraphicsView::NoDrag),
      sceneInteractionAllowed(true), hasSceneRect(false),
      connectedToScene(false),
      useLastMouseEvent(false),
      identityMatrix(true),
      dirtyScroll(true),
      accelerateScrolling(true),
      keepLastCenterPoint(true),
      transforming(false),
      handScrolling(false),
      mustAllocateStyleOptions(false),
      mustResizeBackgroundPixmap(true),
      fullUpdatePending(true),
      hasUpdateClip(false),
      mousePressButton(Qt::NoButton),
      leftIndent(0), topIndent(0),
      alignment(Qt::AlignCenter),
      transformationAnchor(QGraphicsView::AnchorViewCenter), resizeAnchor(QGraphicsView::NoAnchor),
      viewportUpdateMode(QGraphicsView::MinimalViewportUpdate),
      scene(nullptr),
#if QT_CONFIG(rubberband)
      rubberBanding(false),
      rubberBandSelectionMode(Qt::IntersectsItemShape),
      rubberBandSelectionOperation(Qt::ReplaceSelection),
#endif
      handScrollMotions(0),
#ifndef QT_NO_CURSOR
      hasStoredOriginalCursor(false),
#endif
      lastDragDropEvent(nullptr),
      updateSceneSlotReimplementedChecked(false)
{
    styleOptions.reserve(QGRAPHICSVIEW_PREALLOC_STYLE_OPTIONS);
}